

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall kernel::BlockTreeDB::WriteFlag(BlockTreeDB *this,string *name,bool fValue)

{
  bool bVar1;
  long in_FS_OFFSET;
  byte local_49;
  undefined1 local_48 [40];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  pair<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((pair<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_48,"F\x01",name);
  local_49 = fValue | 0x30;
  bVar1 = CDBWrapper::Write<std::pair<unsigned_char,std::__cxx11::string>,unsigned_char>
                    (&this->super_CDBWrapper,
                     (pair<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_48,&local_49,false);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockTreeDB::WriteFlag(const std::string& name, bool fValue)
{
    return Write(std::make_pair(DB_FLAG, name), fValue ? uint8_t{'1'} : uint8_t{'0'});
}